

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
::encode_mapped_value
          (jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
           *this,int32_t k,int32_t mapped_error,int32_t limit)

{
  int32_t bit_count;
  uint32_t bits;
  uint uVar1;
  
  uVar1 = mapped_error >> ((byte)k & 0x1f);
  bit_count = limit - (this->traits_).quantized_bits_per_pixel;
  if ((int)uVar1 < bit_count + -1) {
    if (0x1e < (int)uVar1) {
      encoder_strategy::append_to_bit_stream(&this->super_encoder_strategy,0,uVar1 >> 1);
      uVar1 = uVar1 - (uVar1 >> 1);
    }
    encoder_strategy::append_to_bit_stream(&this->super_encoder_strategy,1,uVar1 + 1);
    bits = ~(-1 << ((byte)k & 0x1f)) & mapped_error;
  }
  else {
    if (0x1f < bit_count) {
      encoder_strategy::append_to_bit_stream(&this->super_encoder_strategy,0,0x1f);
      bit_count = (limit - (this->traits_).quantized_bits_per_pixel) + -0x1f;
    }
    encoder_strategy::append_to_bit_stream(&this->super_encoder_strategy,1,bit_count);
    k = (this->traits_).quantized_bits_per_pixel;
    bits = ~(-1 << ((byte)k & 0x1f)) & mapped_error + 0x7fffffffU;
  }
  encoder_strategy::append_to_bit_stream(&this->super_encoder_strategy,bits,k);
  return;
}

Assistant:

FORCE_INLINE void encode_mapped_value(const int32_t k, const int32_t mapped_error, const int32_t limit)
    {
        int32_t high_bits{mapped_error >> k};

        if (high_bits < limit - traits_.quantized_bits_per_pixel - 1)
        {
            if (high_bits + 1 > 31)
            {
                Strategy::append_to_bit_stream(0, high_bits / 2);
                high_bits = high_bits - high_bits / 2;
            }
            Strategy::append_to_bit_stream(1, high_bits + 1);
            Strategy::append_to_bit_stream((mapped_error & ((1 << k) - 1)), k);
            return;
        }

        if (limit - traits_.quantized_bits_per_pixel > 31)
        {
            Strategy::append_to_bit_stream(0, 31);
            Strategy::append_to_bit_stream(1, limit - traits_.quantized_bits_per_pixel - 31);
        }
        else
        {
            Strategy::append_to_bit_stream(1, limit - traits_.quantized_bits_per_pixel);
        }
        Strategy::append_to_bit_stream((mapped_error - 1) & ((1 << traits_.quantized_bits_per_pixel) - 1),
                                       traits_.quantized_bits_per_pixel);
    }